

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O2

int Aig_ManSeqCleanup(Aig_Man_t *p)

{
  undefined8 uVar1;
  int iVar2;
  int nSizeNew;
  int iVar3;
  int Entry;
  void *pvVar4;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  int iVar7;
  int i;
  
  Aig_ManIncrementTravId(p);
  p->pConst1->TravId = p->nTravIds;
  for (iVar7 = 0; iVar7 < p->nObjs[2] - p->nRegs; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p->vCis,iVar7);
    *(int *)((long)pvVar4 + 0x20) = p->nTravIds;
  }
  p_00 = Vec_PtrAlloc(100);
  for (iVar7 = 0; iVar3 = p->nRegs, iVar7 < p->nObjs[3] - iVar3; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p->vCos,iVar7);
    Vec_PtrPush(p_00,pvVar4);
  }
  for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
    pAVar5 = Aig_ManLi(p,iVar7);
    pAVar6 = Aig_ManLo(p,iVar7);
    (pAVar6->field_0).pNext = pAVar5;
    iVar3 = p->nRegs;
  }
  for (iVar7 = 0; iVar3 = p_00->nSize, iVar7 < iVar3; iVar7 = iVar7 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar7);
    Aig_ManSeqCleanup_rec(p,pAVar5,p_00);
  }
  if (p->nObjs[3] < iVar3) {
    __assert_fail("Vec_PtrSize(vNodes) <= Aig_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                  ,0xb6,"int Aig_ManSeqCleanup(Aig_Man_t *)");
  }
  for (iVar7 = 0; iVar2 = p->nRegs, iVar7 < iVar2; iVar7 = iVar7 + 1) {
    Aig_ManLi(p,iVar7);
    pAVar5 = Aig_ManLo(p,iVar7);
    (pAVar5->field_0).pNext = (Aig_Obj_t *)0x0;
  }
  iVar7 = p->nObjs[3];
  if (iVar3 < iVar7) {
    if (p->vFlopNums != (Vec_Int_t *)0x0) {
      nSizeNew = 0;
      for (i = 0; i < p->vCos->nSize; i = i + 1) {
        pvVar4 = Vec_PtrEntry(p->vCos,i);
        if ((iVar7 - iVar2 <= i) && (*(int *)((long)pvVar4 + 0x20) == p->nTravIds)) {
          Entry = Vec_IntEntry(p->vFlopNums,i + (iVar2 - iVar7));
          Vec_IntWriteEntry(p->vFlopNums,nSizeNew,Entry);
          nSizeNew = nSizeNew + 1;
        }
      }
      if (nSizeNew != iVar3 - (iVar7 - iVar2)) {
        __assert_fail("k == Vec_PtrSize(vNodes) - nTruePos",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                      ,200,"int Aig_ManSeqCleanup(Aig_Man_t *)");
      }
      Vec_IntShrink(p->vFlopNums,nSizeNew);
    }
    p_01 = Vec_PtrAlloc(p->nObjs[2]);
    for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(p->vCis,iVar7);
      if (*(int *)((long)pvVar4 + 0x20) == p->nTravIds) {
        Vec_PtrPush(p_01,pvVar4);
      }
      else {
        Vec_PtrWriteEntry(p->vObjs,*(int *)((long)pvVar4 + 0x24),(void *)0x0);
      }
    }
    p_02 = Vec_PtrAlloc(p->nObjs[3]);
    for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar7);
      if (pAVar5->TravId == p->nTravIds) {
        Vec_PtrPush(p_02,pAVar5);
      }
      else {
        Aig_ObjDisconnect(p,pAVar5);
        Vec_PtrWriteEntry(p->vObjs,pAVar5->Id,(void *)0x0);
      }
    }
    iVar7 = iVar3 - p->nObjs[3];
    p->nRegs = p->nRegs + iVar7;
    if (p_01->nSize != iVar7 + p->nObjs[2]) {
      __assert_fail("Vec_PtrSize(vCis) == nTruePis + p->nRegs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                    ,0xe5,"int Aig_ManSeqCleanup(Aig_Man_t *)");
    }
    if (p_02->nSize != iVar3) {
      __assert_fail("Vec_PtrSize(vCos) == nTruePos + p->nRegs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                    ,0xe6,"int Aig_ManSeqCleanup(Aig_Man_t *)");
    }
    Vec_PtrFree(p->vCis);
    p->vCis = p_01;
    Vec_PtrFree(p->vCos);
    p->vCos = p_02;
    p->nObjs[2] = p->vCis->nSize;
    p->nObjs[3] = iVar3;
  }
  Vec_PtrFree(p_00);
  uVar1 = *(undefined8 *)(p->nObjs + 2);
  p->nTruePis = (int)uVar1 - p->nRegs;
  p->nTruePos = (int)((ulong)uVar1 >> 0x20) - p->nRegs;
  Aig_ManSetCioIds(p);
  iVar7 = Aig_ManCleanup(p);
  return iVar7;
}

Assistant:

int Aig_ManSeqCleanup( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes, * vCis, * vCos;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, nTruePis, nTruePos;
//    assert( Aig_ManBufNum(p) == 0 );

    // mark the PIs
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );

    // prepare to collect nodes reachable from POs
    vNodes = Vec_PtrAlloc( 100 );
    Aig_ManForEachPoSeq( p, pObj, i )
        Vec_PtrPush( vNodes, pObj );

    // remember latch inputs in latch outputs
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = pObjLi;
    // mark the nodes reachable from these nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ManSeqCleanup_rec( p, pObj, vNodes );
    assert( Vec_PtrSize(vNodes) <= Aig_ManCoNum(p) );
    // clean latch output pointers
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = NULL;

    // if some latches are removed, update PIs/POs
    if ( Vec_PtrSize(vNodes) < Aig_ManCoNum(p) )
    {
        if ( p->vFlopNums )
        {
            int nTruePos = Aig_ManCoNum(p)-Aig_ManRegNum(p);
            int iNum, k = 0;
            Aig_ManForEachCo( p, pObj, i )
                if ( i >= nTruePos && Aig_ObjIsTravIdCurrent(p, pObj) )
                {
                    iNum = Vec_IntEntry( p->vFlopNums, i - nTruePos );
                    Vec_IntWriteEntry( p->vFlopNums, k++, iNum );
                }
            assert( k == Vec_PtrSize(vNodes) - nTruePos );
            Vec_IntShrink( p->vFlopNums, k );
        }
        // collect new CIs/COs
        vCis = Vec_PtrAlloc( Aig_ManCiNum(p) );
        Aig_ManForEachCi( p, pObj, i )
            if ( Aig_ObjIsTravIdCurrent(p, pObj) )
                Vec_PtrPush( vCis, pObj );
            else
            {
                Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
//                Aig_ManRecycleMemory( p, pObj );
            }
        vCos = Vec_PtrAlloc( Aig_ManCoNum(p) );
        Aig_ManForEachCo( p, pObj, i )
            if ( Aig_ObjIsTravIdCurrent(p, pObj) )
                Vec_PtrPush( vCos, pObj );
            else
            {
                Aig_ObjDisconnect( p, pObj );
                Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
//                Aig_ManRecycleMemory( p, pObj );
            }
        // remember the number of true PIs/POs
        nTruePis = Aig_ManCiNum(p) - Aig_ManRegNum(p);
        nTruePos = Aig_ManCoNum(p) - Aig_ManRegNum(p);
        // set the new number of registers
        p->nRegs -= Aig_ManCoNum(p) - Vec_PtrSize(vNodes);
        // create new PIs/POs
        assert( Vec_PtrSize(vCis) == nTruePis + p->nRegs );
        assert( Vec_PtrSize(vCos) == nTruePos + p->nRegs );
        Vec_PtrFree( p->vCis );    p->vCis = vCis;
        Vec_PtrFree( p->vCos );    p->vCos = vCos;
        p->nObjs[AIG_OBJ_CI] = Vec_PtrSize( p->vCis );
        p->nObjs[AIG_OBJ_CO] = Vec_PtrSize( p->vCos );
                
    }
    Vec_PtrFree( vNodes );
    p->nTruePis = Aig_ManCiNum(p) - Aig_ManRegNum(p); 
    p->nTruePos = Aig_ManCoNum(p) - Aig_ManRegNum(p); 
    Aig_ManSetCioIds( p );
    // remove dangling nodes
    return Aig_ManCleanup( p );
}